

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

void lzma_mf_hc4_skip(lzma_mf *mf,uint32_t amount)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  uint32_t cur_match;
  uint32_t hash_value;
  uint32_t hash_3_value;
  uint32_t hash_2_value;
  uint32_t temp;
  uint32_t pos;
  uint8_t *cur;
  uint32_t amount_local;
  lzma_mf *mf_local;
  
  cur._4_4_ = amount;
  do {
    uVar2 = mf_avail(mf);
    if (uVar2 < 4) {
      move_pending(mf);
    }
    else {
      pbVar6 = mf_ptr(mf);
      uVar3 = mf->read_pos + mf->offset;
      uVar4 = lzma_crc32_table[0][*pbVar6] ^ (uint)pbVar6[1];
      bVar1 = pbVar6[2];
      uVar5 = (uVar4 ^ (uint)pbVar6[2] << 8 ^ lzma_crc32_table[0][pbVar6[3]] << 5) & mf->hash_mask;
      uVar2 = mf->hash[uVar5 + 0x10400];
      mf->hash[uVar4 & 0x3ff] = uVar3;
      mf->hash[((uVar4 ^ (uint)bVar1 << 8) & 0xffff) + 0x400] = uVar3;
      mf->hash[uVar5 + 0x10400] = uVar3;
      mf->son[mf->cyclic_pos] = uVar2;
      move_pos(mf);
    }
    cur._4_4_ = cur._4_4_ - 1;
  } while (cur._4_4_ != 0);
  return;
}

Assistant:

extern void
lzma_mf_hc4_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		if (mf_avail(mf) < 4) {
			move_pending(mf);
			continue;
		}

		const uint8_t *cur = mf_ptr(mf);
		const uint32_t pos = mf->read_pos + mf->offset;

		hash_4_calc();

		const uint32_t cur_match
				= mf->hash[FIX_4_HASH_SIZE + hash_value];

		mf->hash[hash_2_value] = pos;
		mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
		mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

		hc_skip();

	} while (--amount != 0);
}